

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::asymmVar(SimpSolver *this,Var v)

{
  bool bVar1;
  vec<unsigned_int,_int> *pvVar2;
  int i;
  long lVar3;
  lbool local_1d;
  Var local_1c;
  
  local_1c = v;
  if (this->use_simplification == false) {
    __assert_fail("use_simplification",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1b5,"bool Minisat::SimpSolver::asymmVar(Var)");
  }
  pvVar2 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
           ::lookup(&this->occurs,&local_1c);
  local_1d = Solver::value(&this->super_Solver,local_1c);
  bVar1 = lbool::operator!=(&local_1d,l_Undef);
  if ((bVar1) || (pvVar2->sz == 0)) {
    bVar1 = true;
  }
  else {
    lVar3 = 0;
    do {
      if (pvVar2->sz <= lVar3) {
        bVar1 = backwardSubsumptionCheck(this,false);
        return bVar1;
      }
      bVar1 = asymm(this,local_1c,pvVar2->data[lVar3]);
      lVar3 = lVar3 + 1;
    } while (bVar1);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SimpSolver::asymmVar(Var v)
{
    assert(use_simplification);

    const vec<CRef>& cls = occurs.lookup(v);

    if (value(v) != l_Undef || cls.size() == 0)
        return true;

    for (int i = 0; i < cls.size(); i++)
        if (!asymm(v, cls[i]))
            return false;

    return backwardSubsumptionCheck();
}